

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::PbrMetallicRoughness::PbrMetallicRoughness(PbrMetallicRoughness *this)

{
  initializer_list<double> __l;
  allocator<double> local_49;
  double local_48 [5];
  iterator local_20;
  size_type local_18;
  PbrMetallicRoughness *local_10;
  PbrMetallicRoughness *this_local;
  
  local_48[2] = 1.0;
  local_48[3] = 1.0;
  local_48[0] = 1.0;
  local_48[1] = 1.0;
  local_20 = local_48;
  local_18 = 4;
  local_10 = this;
  std::allocator<double>::allocator(&local_49);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<double,_std::allocator<double>_>::vector(&this->baseColorFactor,__l,&local_49);
  std::allocator<double>::~allocator(&local_49);
  TextureInfo::TextureInfo(&this->baseColorTexture);
  this->metallicFactor = 1.0;
  this->roughnessFactor = 1.0;
  TextureInfo::TextureInfo(&this->metallicRoughnessTexture);
  Value::Value(&this->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions);
  std::__cxx11::string::string((string *)&this->extras_json_string);
  std::__cxx11::string::string((string *)&this->extensions_json_string);
  return;
}

Assistant:

PbrMetallicRoughness() = default;